

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::SerialStream::SerialStream(SerialStream *this,string *targetName)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string *psVar4;
  pointer ppVar5;
  ostream *poVar6;
  long lVar7;
  pointer ppVar8;
  DashelException *pDVar9;
  int *piVar10;
  _union_1457 local_248;
  sigaction act;
  undefined1 auStack_1a8 [4];
  int iFlags;
  termios newtio;
  iterator iStack_160;
  int lockRes;
  _Rb_tree_const_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  int local_14c;
  iterator local_148;
  _Rb_tree_const_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  const_iterator it_1;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ports_1;
  _Self local_100;
  _Base_ptr local_f8;
  _Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  iterator it;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ports;
  string name;
  string devFileName;
  string local_70;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *targetName_local;
  SerialStream *this_local;
  
  local_18 = targetName;
  targetName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ser",&local_39);
  Stream::Stream((Stream *)&this->field_0x1060,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"ser",(allocator<char> *)(devFileName.field_2._M_local_buf + 0xf));
  FileDescriptorStream::FileDescriptorStream
            ((FileDescriptorStream *)this,&PTR_construction_vtable_24__00152058,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)(devFileName.field_2._M_local_buf + 0xf));
  *(undefined **)this = &DAT_00151fc0;
  *(undefined ***)&this->field_0x1060 = &PTR__SerialStream_00152028;
  ParameterSet::add((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                    "ser:port=1;baud=115200;stop=1;parity=none;fc=none;bits=8;dtr=true");
  lVar7 = *(long *)(*(long *)this + -0x18);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  ParameterSet::add((ParameterSet *)(&this->field_0x30 + lVar7),pcVar3);
  std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8));
  bVar1 = ParameterSet::isSet((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18))
                              ,"device");
  if (bVar1) {
    ParameterSet::addParam
              ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"device",
               (char *)0x0,true);
    ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                        "port");
    ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                        "name");
    psVar4 = ParameterSet::get_abi_cxx11_
                       ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                        "device");
    std::__cxx11::string::operator=((string *)(name.field_2._M_local_buf + 8),(string *)psVar4);
  }
  else {
    bVar1 = ParameterSet::isSet((ParameterSet *)
                                (&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"name");
    if (bVar1) {
      ParameterSet::addParam
                ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"name",
                 (char *)0x0,true);
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "port");
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "device");
      psVar4 = ParameterSet::get_abi_cxx11_
                         ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "name");
      std::__cxx11::string::string
                ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)psVar4)
      ;
      SerialPortEnumerator::getPorts_abi_cxx11_();
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree_iterator(&local_f0);
      local_f8 = (_Base_ptr)
                 std::
                 map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::begin((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&it);
      local_f0._M_node = local_f8;
      while( true ) {
        local_100._M_node =
             (_Base_ptr)
             std::
             map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::end((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&it);
        bVar1 = std::operator!=(&local_f0,&local_100);
        if (!bVar1) break;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator->(&local_f0);
        lVar7 = std::__cxx11::string::find
                          ((string *)&(ppVar5->second).second,
                           (ulong)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (lVar7 != -1) {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator->(&local_f0);
          std::__cxx11::string::operator=
                    ((string *)(name.field_2._M_local_buf + 8),(string *)&ppVar5->second);
          poVar6 = std::operator<<((ostream *)&std::cout,"Found ");
          poVar6 = std::operator<<(poVar6,(string *)
                                          &ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
          poVar6 = std::operator<<(poVar6," on port ");
          poVar6 = std::operator<<(poVar6,(string *)(name.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          break;
        }
        std::
        _Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_f0,0);
      }
      lVar7 = std::__cxx11::string::size();
      if (lVar7 == 0) {
        pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
        DashelException::DashelException
                  (pDVar9,ConnectionFailed,0,
                   "The specified name could not be find among the serial ports.",(Stream *)0x0);
        __cxa_throw(pDVar9,&DashelException::typeinfo,DashelException::~DashelException);
      }
      std::
      map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~map((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&it);
      std::__cxx11::string::~string
                ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "device");
      ParameterSet::erase((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                          "name");
      SerialPortEnumerator::getPorts_abi_cxx11_();
      local_14c = ParameterSet::get<int>
                            ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                             "port");
      local_148._M_node =
           (_Base_ptr)
           std::
           map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::find((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&it_1,&local_14c);
      std::
      _Rb_tree_const_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree_const_iterator(&local_140,&local_148);
      iStack_160 = std::
                   map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::end((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&it_1);
      std::
      _Rb_tree_const_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree_const_iterator(&local_158,&stack0xfffffffffffffea0);
      bVar1 = std::operator!=(&local_140,&local_158);
      if (!bVar1) {
        pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
        DashelException::DashelException
                  (pDVar9,ConnectionFailed,0,"The specified serial port does not exists.",
                   (Stream *)0x0);
        __cxa_throw(pDVar9,&DashelException::typeinfo,DashelException::~DashelException);
      }
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator->(&local_140);
      std::__cxx11::string::operator=((string *)(name.field_2._M_local_buf + 8),(char)ppVar8->first)
      ;
      std::
      map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~map((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&it_1);
    }
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = open(pcVar3,2);
  *(int *)&this->field_0x8 = iVar2;
  if (*(int *)&this->field_0x8 == -1) {
    pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar10 = __errno_location();
    DashelException::DashelException
              (pDVar9,ConnectionFailed,*piVar10,"Cannot open serial port.",(Stream *)0x0);
    __cxa_throw(pDVar9,&DashelException::typeinfo,DashelException::~DashelException);
  }
  iVar2 = flock(*(undefined4 *)&this->field_0x8,6);
  if (iVar2 != 0) {
    close(*(int *)&this->field_0x8);
    pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar10 = __errno_location();
    DashelException::DashelException
              (pDVar9,ConnectionFailed,*piVar10,"Cannot lock serial port.",(Stream *)0x0);
    __cxa_throw(pDVar9,&DashelException::typeinfo,DashelException::~DashelException);
  }
  tcgetattr(*(int *)&this->field_0x8,(termios *)&this->oldtio);
  newtio.c_cc[0x17] = '\0';
  newtio.c_cc[0x18] = '\0';
  newtio.c_cc[0x19] = '\0';
  newtio.c_cc[0x1a] = '\0';
  newtio.c_cc[0x1b] = '\0';
  newtio.c_cc[0x1c] = '\0';
  newtio.c_cc[0x1d] = '\0';
  newtio.c_cc[0x1e] = '\0';
  newtio.c_cc[0x1f] = '\0';
  newtio._49_3_ = 0;
  newtio.c_cc[7] = '\0';
  newtio.c_cc[8] = '\0';
  newtio.c_cc[9] = '\0';
  newtio.c_cc[10] = '\0';
  newtio.c_cc[0xb] = '\0';
  newtio.c_cc[0xc] = '\0';
  newtio.c_cc[0xd] = '\0';
  newtio.c_cc[0xe] = '\0';
  newtio.c_cc[0xf] = '\0';
  newtio.c_cc[0x10] = '\0';
  newtio.c_cc[0x11] = '\0';
  newtio.c_cc[0x12] = '\0';
  newtio.c_cc[0x13] = '\0';
  newtio.c_cc[0x14] = '\0';
  newtio.c_cc[0x15] = '\0';
  newtio.c_cc[0x16] = '\0';
  newtio.c_cflag = 0;
  newtio.c_lflag = 0;
  newtio.c_line = '\0';
  newtio.c_cc[0] = '\0';
  newtio.c_cc[1] = '\0';
  newtio.c_cc[2] = '\0';
  newtio.c_cc[3] = '\0';
  newtio.c_cc[4] = '\0';
  newtio.c_cc[5] = '\0';
  newtio.c_cc[6] = '\0';
  auStack_1a8 = (undefined1  [4])0x0;
  iFlags = 0;
  newtio.c_iflag = 0x880;
  newtio.c_oflag = 0;
  iVar2 = ParameterSet::get<int>
                    ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"bits");
  switch(iVar2) {
  case 5:
    break;
  case 6:
    newtio._0_8_ = newtio._0_8_ | 0x10;
    break;
  case 7:
    newtio._0_8_ = newtio._0_8_ | 0x20;
    break;
  case 8:
    newtio._0_8_ = newtio._0_8_ | 0x30;
    break;
  default:
    pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
    DashelException::DashelException
              (pDVar9,InvalidTarget,0,"Invalid number of bits per character, must be 5, 6, 7, or 8."
               ,(Stream *)0x0);
    __cxa_throw(pDVar9,&DashelException::typeinfo,DashelException::~DashelException);
  }
  psVar4 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"stop")
  ;
  bVar1 = std::operator==(psVar4,"2");
  if (bVar1) {
    newtio._0_8_ = newtio._0_8_ | 0x40;
  }
  psVar4 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"fc");
  bVar1 = std::operator==(psVar4,"hard");
  if (bVar1) {
    newtio._0_8_ = newtio._0_8_ | 0x80000000;
  }
  psVar4 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                      "parity");
  bVar1 = std::operator!=(psVar4,"none");
  if (bVar1) {
    newtio._0_8_ = newtio._0_8_ | 0x100;
    psVar4 = ParameterSet::get_abi_cxx11_
                       ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),
                        "parity");
    bVar1 = std::operator==(psVar4,"odd");
    if (bVar1) {
      newtio._0_8_ = newtio._0_8_ | 0x200;
    }
  }
  iVar2 = ParameterSet::get<int>
                    ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"baud");
  if (iVar2 != 0) {
    if (iVar2 == 0x32) {
      newtio.c_iflag = newtio.c_iflag | 1;
    }
    else if (iVar2 == 0x4b) {
      newtio.c_iflag = newtio.c_iflag | 2;
    }
    else if (iVar2 == 0x6e) {
      newtio.c_iflag = newtio.c_iflag | 3;
    }
    else if (iVar2 == 0x86) {
      newtio.c_iflag = newtio.c_iflag | 4;
    }
    else if (iVar2 == 0x96) {
      newtio.c_iflag = newtio.c_iflag | 5;
    }
    else if (iVar2 == 200) {
      newtio.c_iflag = newtio.c_iflag | 6;
    }
    else if (iVar2 == 300) {
      newtio.c_iflag = newtio.c_iflag | 7;
    }
    else if (iVar2 == 600) {
      newtio.c_iflag = newtio.c_iflag | 8;
    }
    else if (iVar2 == 0x4b0) {
      newtio.c_iflag = newtio.c_iflag | 9;
    }
    else if (iVar2 == 0x708) {
      newtio.c_iflag = newtio.c_iflag | 10;
    }
    else if (iVar2 == 0x960) {
      newtio.c_iflag = newtio.c_iflag | 0xb;
    }
    else if (iVar2 == 0x12c0) {
      newtio.c_iflag = newtio.c_iflag | 0xc;
    }
    else if (iVar2 == 0x2580) {
      newtio.c_iflag = newtio.c_iflag | 0xd;
    }
    else if (iVar2 == 0x4b00) {
      newtio.c_iflag = newtio.c_iflag | 0xe;
    }
    else if (iVar2 == 0x9600) {
      newtio.c_iflag = newtio.c_iflag | 0xf;
    }
    else if (iVar2 == 0xe100) {
      newtio.c_iflag = newtio.c_iflag | 0x1001;
    }
    else if (iVar2 == 0x1c200) {
      newtio.c_iflag = newtio.c_iflag | 0x1002;
    }
    else if (iVar2 == 0x38400) {
      newtio.c_iflag = newtio.c_iflag | 0x1003;
    }
    else if (iVar2 == 0x70800) {
      newtio.c_iflag = newtio.c_iflag | 0x1004;
    }
    else if (iVar2 == 500000) {
      newtio.c_iflag = newtio.c_iflag | 0x1005;
    }
    else if (iVar2 == 0x8ca00) {
      newtio.c_iflag = newtio.c_iflag | 0x1006;
    }
    else if (iVar2 == 0xe1000) {
      newtio.c_iflag = newtio.c_iflag | 0x1007;
    }
    else if (iVar2 == 1000000) {
      newtio.c_iflag = newtio.c_iflag | 0x1008;
    }
    else if (iVar2 == 0x119400) {
      newtio.c_iflag = newtio.c_iflag | 0x1009;
    }
    else if (iVar2 == 1500000) {
      newtio.c_iflag = newtio.c_iflag | 0x100a;
    }
    else if (iVar2 == 2000000) {
      newtio.c_iflag = newtio.c_iflag | 0x100b;
    }
    else if (iVar2 == 2500000) {
      newtio.c_iflag = newtio.c_iflag | 0x100c;
    }
    else if (iVar2 == 3000000) {
      newtio.c_iflag = newtio.c_iflag | 0x100d;
    }
    else if (iVar2 == 3500000) {
      newtio.c_iflag = newtio.c_iflag | 0x100e;
    }
    else {
      if (iVar2 != 4000000) {
        pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
        DashelException::DashelException
                  (pDVar9,ConnectionFailed,0,"Invalid baud rate.",(Stream *)0x0);
        __cxa_throw(pDVar9,&DashelException::typeinfo,DashelException::~DashelException);
      }
      newtio.c_iflag = newtio.c_iflag | 0x100f;
    }
  }
  auStack_1a8 = (undefined1  [4])0x4;
  iFlags = 0;
  newtio.c_oflag = 0;
  newtio._8_7_ = newtio._8_7_ & 0xffffffffffff;
  newtio.c_lflag._3_1_ = 1;
  iVar2 = tcflush(*(int *)&this->field_0x8,2);
  if ((-1 < iVar2) &&
     (iVar2 = tcsetattr(*(int *)&this->field_0x8,0,(termios *)auStack_1a8), -1 < iVar2)) {
    act.sa_restorer._4_4_ = 2;
    bVar1 = ParameterSet::get<bool>
                      ((ParameterSet *)(&this->field_0x30 + *(long *)(*(long *)this + -0x18)),"dtr")
    ;
    if (bVar1) {
      ioctl(*(int *)&this->field_0x8,0x5416,(undefined1 *)((long)&act.sa_restorer + 4));
    }
    else {
      ioctl(*(int *)&this->field_0x8,0x5417,(undefined1 *)((long)&act.sa_restorer + 4));
    }
    memset(&local_248,0,0x98);
    local_248 = (_union_1457)0x1;
    sigaction(1,(sigaction *)&local_248,(sigaction *)0x0);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    return;
  }
  pDVar9 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException
            (pDVar9,ConnectionFailed,0,
             "Cannot setup serial port. The requested baud rate might not be supported.",
             (Stream *)0x0);
  __cxa_throw(pDVar9,&DashelException::typeinfo,DashelException::~DashelException);
}

Assistant:

explicit SerialStream(const string& targetName) :
			Stream("ser"),
			FileDescriptorStream("ser")
		{
			target.add("ser:port=1;baud=115200;stop=1;parity=none;fc=none;bits=8;dtr=true");
			target.add(targetName.c_str());
			string devFileName;

			if (target.isSet("device"))
			{
				target.addParam("device", NULL, true);
				target.erase("port");
				target.erase("name");

				devFileName = target.get("device");
			}
			else if (target.isSet("name"))
			{
				target.addParam("name", NULL, true);
				target.erase("port");
				target.erase("device");

				// Enumerates the ports
				std::string name = target.get("name");
				std::map<int, std::pair<std::string, std::string> > ports = SerialPortEnumerator::getPorts();

				// Iterate on all ports to found one with "name" in its description
				std::map<int, std::pair<std::string, std::string> >::iterator it;
				for (it = ports.begin(); it != ports.end(); it++)
				{
					if (it->second.second.find(name) != std::string::npos)
					{
						devFileName = it->second.first;
						std::cout << "Found " << name << " on port " << devFileName << std::endl;
						break;
					}
				}
				if (devFileName.size() == 0)
					throw DashelException(DashelException::ConnectionFailed, 0, "The specified name could not be find among the serial ports.");
			}
			else // port
			{
				target.erase("device");
				target.erase("name");

				std::map<int, std::pair<std::string, std::string> > ports = SerialPortEnumerator::getPorts();
				std::map<int, std::pair<std::string, std::string> >::const_iterator it = ports.find(target.get<int>("port"));
				if (it != ports.end())
				{
					devFileName = it->first;
				}
				else
					throw DashelException(DashelException::ConnectionFailed, 0, "The specified serial port does not exists.");
			}

			fd = open(devFileName.c_str(), O_RDWR);
			if (fd == -1)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot open serial port.");

			int lockRes = flock(fd, LOCK_EX | LOCK_NB);
			if (lockRes != 0)
			{
				close(fd);
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot lock serial port.");
			}

			struct termios newtio;

			// save old serial port state and clear new one
			tcgetattr(fd, &oldtio);
			memset(&newtio, 0, sizeof(newtio));

			newtio.c_cflag |= CLOCAL; // ignore modem control lines.
			newtio.c_cflag |= CREAD; // enable receiver.
			switch (target.get<int>("bits")) // Set amount of bits per character
			{
				case 5: newtio.c_cflag |= CS5; break;
				case 6: newtio.c_cflag |= CS6; break;
				case 7: newtio.c_cflag |= CS7; break;
				case 8: newtio.c_cflag |= CS8; break;
				default: throw DashelException(DashelException::InvalidTarget, 0, "Invalid number of bits per character, must be 5, 6, 7, or 8.");
			}
			if (target.get("stop") == "2")
				newtio.c_cflag |= CSTOPB; // Set two stop bits, rather than one.
			if (target.get("fc") == "hard")
				newtio.c_cflag |= CRTSCTS; // enable hardware flow control
			if (target.get("parity") != "none")
			{
				newtio.c_cflag |= PARENB; // enable parity generation on output and parity checking for input.
				if (target.get("parity") == "odd")
					newtio.c_cflag |= PARODD; // parity for input and output is odd.
			}

#ifdef MACOSX
			if (cfsetspeed(&newtio, target.get<int>("baud")) != 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Invalid baud rate.");
#else
			switch (target.get<int>("baud"))
			{
				case 0: newtio.c_cflag |= B0; break;
				case 50: newtio.c_cflag |= B50; break;
				case 75: newtio.c_cflag |= B75; break;
				case 110: newtio.c_cflag |= B110; break;
				case 134: newtio.c_cflag |= B134; break;
				case 150: newtio.c_cflag |= B150; break;
				case 200: newtio.c_cflag |= B200; break;
				case 300: newtio.c_cflag |= B300; break;
				case 600: newtio.c_cflag |= B600; break;
				case 1200: newtio.c_cflag |= B1200; break;
				case 1800: newtio.c_cflag |= B1800; break;
				case 2400: newtio.c_cflag |= B2400; break;
				case 4800: newtio.c_cflag |= B4800; break;
				case 9600: newtio.c_cflag |= B9600; break;
				case 19200: newtio.c_cflag |= B19200; break;
				case 38400: newtio.c_cflag |= B38400; break;
				case 57600: newtio.c_cflag |= B57600; break;
				case 115200: newtio.c_cflag |= B115200; break;
				case 230400: newtio.c_cflag |= B230400; break;
				case 460800: newtio.c_cflag |= B460800; break;
				case 500000: newtio.c_cflag |= B500000; break;
				case 576000: newtio.c_cflag |= B576000; break;
				case 921600: newtio.c_cflag |= B921600; break;
				case 1000000: newtio.c_cflag |= B1000000; break;
				case 1152000: newtio.c_cflag |= B1152000; break;
				case 1500000: newtio.c_cflag |= B1500000; break;
				case 2000000: newtio.c_cflag |= B2000000; break;
#ifdef B2500000
				case 2500000: newtio.c_cflag |= B2500000; break;
#endif // B2500000
#ifdef B3000000
				case 3000000: newtio.c_cflag |= B3000000; break;
#endif // B3000000
#ifdef B3500000
				case 3500000: newtio.c_cflag |= B3500000; break;
#endif // B3500000
#ifdef B4000000
				case 4000000: newtio.c_cflag |= B4000000; break;
#endif // B4000000
				default: throw DashelException(DashelException::ConnectionFailed, 0, "Invalid baud rate.");
			}
#endif

			newtio.c_iflag = IGNPAR; // ignore parity on input

			newtio.c_oflag = 0;

			newtio.c_lflag = 0;

			newtio.c_cc[VTIME] = 0; // block forever if no byte
			newtio.c_cc[VMIN] = 1; // one byte is sufficient to return

			// set attributes
			if ((tcflush(fd, TCIOFLUSH) < 0) || (tcsetattr(fd, TCSANOW, &newtio) < 0))
				throw DashelException(DashelException::ConnectionFailed, 0, "Cannot setup serial port. The requested baud rate might not be supported.");

			// Enable or disable DTR
			int iFlags = TIOCM_DTR;
			if (target.get<bool>("dtr"))
				ioctl(fd, TIOCMBIS, &iFlags);
			else
				ioctl(fd, TIOCMBIC, &iFlags);

			//Ignore SIGHUP from this point ownward, as it may be emitted and lead to a crash on some POSIX
			//implementations, despite CLOCAL being set
			//TODO: we should probably reset the signal to its initial state when all devices are disconnected.
			struct sigaction act;
			memset(&act, 0, sizeof(act));
			act.sa_handler = SIG_IGN;
			sigaction(SIGHUP, &act, NULL);
		}